

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

string * __thiscall kws::Parser::FindNextWord_abi_cxx11_(Parser *this,size_t pos)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong in_RDX;
  long in_RSI;
  string *in_RDI;
  bool bVar4;
  bool first;
  bool inWord;
  size_t i;
  string *ivar;
  byte local_69;
  allocator local_24;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  ulong local_20;
  
  local_20 = in_RDX;
  while( true ) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
    uVar1 = local_20;
    bVar4 = false;
    if (*pcVar2 != ' ') {
      uVar3 = std::__cxx11::string::size();
      bVar4 = uVar1 < uVar3;
    }
    if (!bVar4) break;
    local_20 = local_20 + 1;
  }
  local_21 = 1;
  local_22 = 0;
  local_23 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_24);
  std::allocator<char>::~allocator((allocator<char> *)&local_24);
  while( true ) {
    uVar1 = local_20;
    uVar3 = std::__cxx11::string::size();
    local_69 = 0;
    if (uVar1 < uVar3) {
      local_69 = local_21;
    }
    if ((local_69 & 1) == 0) break;
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
    if ((*pcVar2 == ' ') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518), *pcVar2 == '\r')) {
      if ((local_22 & 1) != 0) {
        local_21 = 0;
      }
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
      std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
      local_21 = 1;
      local_22 = 1;
    }
    local_20 = local_20 + 1;
  }
  return in_RDI;
}

Assistant:

std::string Parser::FindNextWord(size_t pos) const
{
  size_t i=pos;

  // we go to the next space
  while(m_BufferNoComment[i] != ' ' && i<m_BufferNoComment.size())
    {
    i++;
    }

  bool inWord = true;
  bool first = false;
  std::string ivar = "";
  while(i<m_BufferNoComment.size() && inWord)
    {
    if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\r')
      {
      ivar += m_BufferNoComment[i];
      inWord = true;
      first = true;
      }
    else // we have a space
      {
      if(first)
        {
        inWord = false;
        }
      }
    i++;
    }
  return ivar;
}